

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_cast_expression.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,CastExpression *expr,
          idx_t depth)

{
  LogicalType *type;
  Binder *this_00;
  ClientContext *pCVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  undefined8 uVar3;
  bool bVar4;
  type expr_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  type expr_01;
  ErrorData error;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_170;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_168;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_160;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_158;
  undefined1 local_150 [48];
  optional_idx local_120;
  optional_idx local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e8 [56];
  undefined1 local_b0 [40];
  _Alloc_hider local_88;
  tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_> local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  Bind((ErrorData *)(local_150 + 0x20),this,&expr->child,depth,false);
  if (local_150[0x20] == '\x01') {
    local_b0._0_2_ = local_150._32_2_;
    if ((optional_idx *)local_150._40_8_ == &local_118) {
      local_b0._32_4_ = uStack_110;
      local_b0._36_4_ = uStack_10c;
      local_b0._8_8_ = (optional_idx *)(local_b0 + 0x18);
    }
    else {
      local_b0._8_8_ = local_150._40_8_;
    }
    local_b0._16_8_ = local_120.index;
    local_120.index = 0;
    local_118.index._0_4_ = (uint)local_118.index & 0xffffff00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_pi == &local_f8) {
      local_78._8_4_ = local_f8._8_4_;
      local_78._12_4_ = local_f8._12_4_;
      local_88._M_p = (pointer)(local_b0 + 0x38);
    }
    else {
      local_88._M_p = (pointer)local_108._M_pi;
    }
    local_80.
    super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>.
    super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
         (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
         local_100._M_t.
         super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
    local_100._M_t.
    super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>.
    super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
          )(__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
           0x0;
    local_f8._M_allocated_capacity._0_4_ = local_f8._M_allocated_capacity._0_4_ & 0xffffff00;
    local_150._40_8_ = &local_118;
    local_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_f8;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(local_b0 + 0x48),local_e8);
    BindResult::BindResult(__return_storage_ptr__,(ErrorData *)local_b0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_b0 + 0x48));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_b0 + 0x38)) {
      operator_delete(local_88._M_p);
    }
    if ((optional_idx *)local_b0._8_8_ != (optional_idx *)(local_b0 + 0x18)) {
      operator_delete((void *)local_b0._8_8_);
    }
  }
  else {
    this_00 = this->binder;
    local_150._0_8_ = (Expression *)(local_150 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,anon_var_dwarf_4ed193b + 9);
    type = &expr->cast_type;
    Binder::BindLogicalType
              (this_00,type,(optional_ptr<duckdb::Catalog,_true>)0x0,(string *)local_150);
    if ((Expression *)local_150._0_8_ != (Expression *)(local_150 + 0x10)) {
      operator_delete((void *)local_150._0_8_);
    }
    expr_00 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(&expr->child);
    this_01 = BoundExpression::GetExpression(expr_00);
    if (expr->try_cast == true) {
      expr_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(this_01);
      GetExpressionReturnType((LogicalType *)local_150,expr_01);
      bVar4 = LogicalType::operator==((LogicalType *)local_150,type);
      LogicalType::~LogicalType((LogicalType *)local_150);
      if (bVar4) {
        local_158._M_head_impl =
             (this_01->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        BindResult::BindResult
                  (__return_storage_ptr__,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_158);
        if (local_158._M_head_impl != (Expression *)0x0) {
          (*((local_158._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_158._M_head_impl = (Expression *)0x0;
        goto LAB_00d741e4;
      }
      pCVar1 = this->context;
      local_160._M_head_impl =
           (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)local_150,pCVar1,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_160,type,true);
      uVar3 = local_150._0_8_;
      local_150._0_8_ = (long *)0x0;
      _Var2._M_head_impl =
           (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar3;
      if (_Var2._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
        if ((long *)local_150._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_150._0_8_ + 8))();
        }
      }
      local_150._0_8_ = (Expression *)0x0;
      if (local_160._M_head_impl != (Expression *)0x0) {
        (*((local_160._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_160._M_head_impl = (Expression *)0x0;
    }
    else {
      pCVar1 = this->context;
      local_168._M_head_impl =
           (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)local_150,pCVar1,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_168,type,false);
      uVar3 = local_150._0_8_;
      local_150._0_8_ = (long *)0x0;
      _Var2._M_head_impl =
           (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar3;
      if (_Var2._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
        if ((long *)local_150._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_150._0_8_ + 8))();
        }
      }
      local_150._0_8_ = (Expression *)0x0;
      if (local_168._M_head_impl != (Expression *)0x0) {
        (*((local_168._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_168._M_head_impl = (Expression *)0x0;
    }
    local_170._M_head_impl =
         (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_170);
    if (local_170._M_head_impl != (Expression *)0x0) {
      (*((local_170._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_170._M_head_impl = (Expression *)0x0;
  }
LAB_00d741e4:
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_pi != &local_f8) {
    operator_delete(local_108._M_pi);
  }
  if ((optional_idx *)local_150._40_8_ != &local_118) {
    operator_delete((void *)local_150._40_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindExpression(CastExpression &expr, idx_t depth) {
	// first try to bind the child of the cast expression
	auto error = Bind(expr.child, depth);
	if (error.HasError()) {
		return BindResult(std::move(error));
	}
	// FIXME: We can also implement 'hello'::schema.custom_type; and pass by the schema down here.
	// Right now just considering its DEFAULT_SCHEMA always
	binder.BindLogicalType(expr.cast_type);
	// the children have been successfully resolved
	auto &child = BoundExpression::GetExpression(*expr.child);
	if (expr.try_cast) {
		if (ExpressionBinder::GetExpressionReturnType(*child) == expr.cast_type) {
			// no cast required: type matches
			return BindResult(std::move(child));
		}
		child = BoundCastExpression::AddCastToType(context, std::move(child), expr.cast_type, true);
	} else {
		// otherwise add a cast to the target type
		child = BoundCastExpression::AddCastToType(context, std::move(child), expr.cast_type);
	}
	return BindResult(std::move(child));
}